

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display-curses.c
# Opt level: O3

char dspl_Victory(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  timespec local_40;
  
  if (_stdscr == 0) {
    iVar5 = -1;
  }
  else {
    iVar5 = *(short *)(_stdscr + 4) + 1;
  }
  cbreak();
  nodelay();
  FlyingCard.m_enabled = true;
  cVar1 = '\0';
  do {
    iVar2 = rand();
    FlyingCard.m_dirX = iVar2 % 7 + -3;
    iVar2 = rand();
    FlyingCard.m_x = iVar2 % 0x3c;
    uVar3 = rand();
    bVar6 = (uVar3 & 1) != 0;
    FlyingCard.m_dirY = (bVar6 - 1) + (uint)bVar6;
    FlyingCard.m_y = -7;
    if (!bVar6) {
      FlyingCard.m_y = iVar5;
    }
    iVar2 = rand();
    FlyingCard.m_card.m_color = iVar2 % 4;
    iVar2 = rand();
    FlyingCard.m_card.m_type = iVar2 % 0xd + CT_ACE;
    iVar2 = rand();
    FlyingCard.m_card.m_face = (ECardFace_t)(0x33333332 < iVar2 * -0x33333333 + 0x19999999U);
    iVar2 = rand();
    if (-7 < iVar5) {
      iVar4 = iVar5 + 7;
      do {
        if (FlyingCard.m_enabled == true) {
          FlyingCard.m_x = FlyingCard.m_x + FlyingCard.m_dirX;
          if (0x3c < (uint)FlyingCard.m_x) {
            FlyingCard.m_dirX = -FlyingCard.m_dirX;
          }
          FlyingCard.m_y = FlyingCard.m_y + FlyingCard.m_dirY;
        }
        dspl_Render(CMD_NONE);
        local_40.tv_sec = 0;
        local_40.tv_nsec =
             (long)(int)((iVar2 + ((uint)((ulong)((long)iVar2 * 0x51eb851f) >> 0x24) -
                                  (iVar2 >> 0x1f)) * -0x32) * 1000000 + 10000000);
        nanosleep(&local_40,(timespec *)0x0);
        cVar1 = input_ReadKey();
        if (cVar1 != '\0') goto LAB_00102ba2;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      cVar1 = '\0';
    }
LAB_00102ba2:
    if ('\0' < cVar1) {
      FlyingCard.m_enabled = false;
      nodelay(_stdscr,0);
      return cVar1;
    }
  } while( true );
}

Assistant:

char dspl_Victory(void)
{
  int maxX = getmaxy(stdscr);
  char key = 0;

  cbreak();
  nodelay(stdscr, TRUE);

  FlyingCard.m_enabled = true;
  while (key <= 0) {
    ResetFlying(maxX);
    int sleepTime = (rand() % 50) + 10;
    for (int i = 0; i < (maxX + CARD_HEIGHT); i++) {
      MoveFlying();
      dspl_Render(CMD_NONE);
      SleepMs(sleepTime);

      key = input_ReadKey();
      if (key) {
        break;
      }
    }
  }
  FlyingCard.m_enabled = false;

  nodelay(stdscr, FALSE);

  return key;
}